

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::DefaultsTest::CheckValue<void*>
          (DefaultsTest *this,void *value,void *reference_value,GLchar *pname_string,
          GLchar *function_string)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  MessageBuilder local_1b8;
  GLchar *local_38;
  GLchar *function_string_local;
  GLchar *pname_string_local;
  void *reference_value_local;
  void *value_local;
  DefaultsTest *this_local;
  
  if (reference_value != value) {
    local_38 = function_string;
    function_string_local = pname_string;
    pname_string_local = (GLchar *)reference_value;
    reference_value_local = value;
    value_local = this;
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<(&local_1b8,&local_38);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [14])0x2a79a4c);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&function_string_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [26])" parameter name returned ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&reference_value_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [7])0x2a796ef);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&pname_string_local);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [15])0x2a7d12b);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  }
  return reference_value == value;
}

Assistant:

bool DefaultsTest::CheckValue(const T value, const T reference_value, const glw::GLchar* pname_string,
							  const glw::GLchar* function_string)
{
	if (reference_value != value)
	{
		/* Log. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << function_string << " called with "
											<< pname_string << " parameter name returned " << value << ", but "
											<< reference_value << " was expected." << tcu::TestLog::EndMessage;

		return false;
	}
	return true;
}